

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

equality_t bn_cmp(bn_t *a,bn_t *b)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  unsigned_long_long in_stack_00000010;
  int bn_cmp_result;
  bn *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = bignum_cmp((bn *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
  if (iVar2 == -1) {
    local_c = Smaller;
  }
  else if (iVar2 == 0) {
    local_c = Equal;
  }
  else {
    if (iVar2 != 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        PANIC((char *)a,(char *)b,in_stack_00000010);
      }
      goto LAB_00102800;
    }
    local_c = Bigger;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c;
  }
LAB_00102800:
  __stack_chk_fail();
}

Assistant:

equality_t
bn_cmp(bn_t* a, bn_t* b)
{
  int bn_cmp_result = bignum_cmp(&a->inner, &b->inner);
  switch (bn_cmp_result) {
    case LARGER:
      return Bigger;
      break;
    case SMALLER:
      return Smaller;
      break;
    case EQUAL:
      return Equal;
      break;
    default:
      /* memory corruption detected */
      PANIC("bn_cmp", __FILE__, __LINE__);
  }
}